

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void * stbi__pnm_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  int iVar1;
  stbi__context *local_48;
  stbi_uc *out;
  stbi__result_info *ri_local;
  int req_comp_local;
  int *comp_local;
  int *y_local;
  int *x_local;
  stbi__context *s_local;
  
  iVar1 = stbi__pnm_info(s,(int *)s,(int *)&s->img_y,&s->img_n);
  ri->bits_per_channel = iVar1;
  if (ri->bits_per_channel == 0) {
    s_local = (stbi__context *)0x0;
  }
  else if (s->img_y < 0x1000001) {
    if (s->img_x < 0x1000001) {
      *x = s->img_x;
      *y = s->img_y;
      if (comp != (int *)0x0) {
        *comp = s->img_n;
      }
      iVar1 = stbi__mad4sizes_valid(s->img_n,s->img_x,s->img_y,ri->bits_per_channel / 8,0);
      if (iVar1 == 0) {
        stbi__err("PNM too large");
        s_local = (stbi__context *)0x0;
      }
      else {
        local_48 = (stbi__context *)
                   stbi__malloc_mad4(s->img_n,s->img_x,s->img_y,ri->bits_per_channel / 8,0);
        if (local_48 == (stbi__context *)0x0) {
          stbi__err("Out of memory");
          s_local = (stbi__context *)0x0;
        }
        else {
          iVar1 = stbi__getn(s,(stbi_uc *)local_48,
                             s->img_n * s->img_x * s->img_y * (ri->bits_per_channel / 8));
          if (iVar1 == 0) {
            free(local_48);
            stbi__err("PNM file truncated");
            s_local = (stbi__context *)0x0;
          }
          else {
            if ((req_comp != 0) && (req_comp != s->img_n)) {
              if (ri->bits_per_channel == 0x10) {
                local_48 = (stbi__context *)
                           stbi__convert_format16
                                     ((stbi__uint16 *)local_48,s->img_n,req_comp,s->img_x,s->img_y);
              }
              else {
                local_48 = (stbi__context *)
                           stbi__convert_format
                                     ((uchar *)local_48,s->img_n,req_comp,s->img_x,s->img_y);
              }
              if (local_48 == (stbi__context *)0x0) {
                return (void *)0x0;
              }
            }
            s_local = local_48;
          }
        }
      }
    }
    else {
      stbi__err("Very large image (corrupt?)");
      s_local = (stbi__context *)0x0;
    }
  }
  else {
    stbi__err("Very large image (corrupt?)");
    s_local = (stbi__context *)0x0;
  }
  return s_local;
}

Assistant:

static void *stbi__pnm_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   stbi_uc *out;
   STBI_NOTUSED(ri);

   ri->bits_per_channel = stbi__pnm_info(s, (int *)&s->img_x, (int *)&s->img_y, (int *)&s->img_n);
   if (ri->bits_per_channel == 0)
      return 0;

   if (s->img_y > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");
   if (s->img_x > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");

   *x = s->img_x;
   *y = s->img_y;
   if (comp) *comp = s->img_n;

   if (!stbi__mad4sizes_valid(s->img_n, s->img_x, s->img_y, ri->bits_per_channel / 8, 0))
      return stbi__errpuc("too large", "PNM too large");

   out = (stbi_uc *) stbi__malloc_mad4(s->img_n, s->img_x, s->img_y, ri->bits_per_channel / 8, 0);
   if (!out) return stbi__errpuc("outofmem", "Out of memory");
   if (!stbi__getn(s, out, s->img_n * s->img_x * s->img_y * (ri->bits_per_channel / 8))) {
      STBI_FREE(out);
      return stbi__errpuc("bad PNM", "PNM file truncated");
   }

   if (req_comp && req_comp != s->img_n) {
      if (ri->bits_per_channel == 16) {
         out = (stbi_uc *) stbi__convert_format16((stbi__uint16 *) out, s->img_n, req_comp, s->img_x, s->img_y);
      } else {
         out = stbi__convert_format(out, s->img_n, req_comp, s->img_x, s->img_y);
      }
      if (out == NULL) return out; // stbi__convert_format frees input on failure
   }
   return out;
}